

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

Instr * __thiscall
LowererMDArch::LowerCallIDynamic
          (LowererMDArch *this,Instr *callInstr,Instr *saveThisArgOutInstr,Opnd *argsLength,
          ushort callFlags,Instr *insertBeforeInstrForCFG)

{
  code *pcVar1;
  bool bVar2;
  IntConstOpnd *pIVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  Instr *pIVar6;
  ushort uVar7;
  uint32 argCount;
  
  IR::Instr::InsertBefore(callInstr,saveThisArgOutInstr);
  LoadDynamicArgument(this,saveThisArgOutInstr,3);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    pIVar3 = IR::Opnd::AsIntConstOpnd(argsLength);
    uVar7 = callInstr->m_func->actualCount;
    if ((pIVar3->super_EncodableOpnd<long>).m_value != (ulong)uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x260,
                         "(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount)"
                         ,
                         "argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      uVar7 = callInstr->m_func->actualCount;
    }
    if (this->m_func->m_argSlotsForFunctionsCalled < uVar7 + 3) {
      this->m_func->m_argSlotsForFunctionsCalled = uVar7 + 3;
    }
  }
  else {
    pIVar3 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
    pIVar6 = IR::Instr::New(ADD,argsLength,argsLength,&pIVar3->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    if (this->m_func->m_argSlotsForFunctionsCalled < 0x12) {
      this->m_func->m_argSlotsForFunctionsCalled = 0x12;
    }
  }
  pOVar5 = GetArgSlotOpnd(this,2,(StackSym *)0x0,false);
  pIVar6 = IR::Instr::New(MOV,pOVar5,argsLength,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  pOVar5 = IR::Instr::UnlinkSrc1(callInstr);
  GeneratePreCall(this,callInstr,pOVar5,insertBeforeInstrForCFG);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    argCount = callInstr->m_func->actualCount + 2;
  }
  else {
    argCount = 4;
  }
  LowerCall(this,callInstr,argCount);
  return callInstr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerCallIDynamic(IR::Instr *callInstr, IR::Instr*saveThisArgOutInstr, IR::Opnd *argsLength, ushort callFlags, IR::Instr * insertBeforeInstrForCFG)
{
    callInstr->InsertBefore(saveThisArgOutInstr); //Move this Argout next to call;
    this->LoadDynamicArgument(saveThisArgOutInstr, 3); //this pointer is the 3rd argument

    /*callInfo*/
    if (callInstr->m_func->IsInlinee())
    {
        Assert(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount);
        this->SetMaxArgSlots((Js::ArgSlot)callInstr->m_func->actualCount);
    }
    else
    {
        callInstr->InsertBefore(IR::Instr::New(Js::OpCode::ADD, argsLength, argsLength, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), this->m_func));
        this->SetMaxArgSlots(Js::InlineeCallInfo::MaxInlineeArgoutCount);
    }
    callInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, this->GetArgSlotOpnd(2), argsLength, this->m_func));

    IR::Opnd    *funcObjOpnd = callInstr->UnlinkSrc1();
    GeneratePreCall(callInstr, funcObjOpnd, insertBeforeInstrForCFG);

    // Normally for dynamic calls we move 4 args to registers and push remaining
    // args onto stack (Windows convention, and unchanged on xplat). We need to
    // manully home 4 args. inlinees lower differently and follow platform ABI.
    // So we need to manually home actualArgsCount + 2 args (function, callInfo).
    const uint32 homeArgs = callInstr->m_func->IsInlinee() ?
                                callInstr->m_func->actualCount + 2 : 4;
    LowerCall(callInstr, homeArgs);

    return callInstr;
}